

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmWin.c
# Opt level: O0

int Sfm_ObjIsUseful(Sfm_Ntk_t *p,int iNode)

{
  int iVar1;
  int local_20;
  int iFanout;
  int i;
  int iNode_local;
  Sfm_Ntk_t *p_local;
  
  iVar1 = Sfm_ObjIsFixed(p,iNode);
  if (iVar1 == 0) {
    p_local._4_4_ = 1;
  }
  else {
    for (local_20 = 0; iVar1 = Sfm_ObjFanoutNum(p,iNode), local_20 < iVar1; local_20 = local_20 + 1)
    {
      iVar1 = Sfm_ObjFanout(p,iNode,local_20);
      iVar1 = Sfm_ObjIsFixed(p,iVar1);
      if (iVar1 == 0) {
        return 1;
      }
    }
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

static inline int Sfm_ObjIsUseful( Sfm_Ntk_t * p, int iNode )
{
    int i, iFanout;
    if ( !Sfm_ObjIsFixed(p, iNode) )
        return 1;
    Sfm_ObjForEachFanout( p, iNode, iFanout, i )
        if ( !Sfm_ObjIsFixed(p, iFanout) )
            return 1;
    return 0;
}